

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

const_iterator __thiscall QUrlQueryPrivate::findKey(QUrlQueryPrivate *this,QString *key)

{
  long lVar1;
  const_iterator cVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_ffffffffffffff88;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  int from;
  QUrlQueryPrivate *this_00;
  QString *in_stack_ffffffffffffffd0;
  QUrlQueryPrivate *in_stack_ffffffffffffffd8;
  
  from = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<std::pair<QString,_QString>_>::constBegin(in_stack_ffffffffffffff90);
  this_00 = (QUrlQueryPrivate *)&stack0xffffffffffffffd8;
  recodeFromUser(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  findRecodedKey(this_00,in_RDI,from);
  cVar2 = QList<std::pair<QString,_QString>_>::const_iterator::operator+
                    ((const_iterator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QString::~QString((QString *)0x3173d4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (const_iterator)cVar2.i;
  }
  __stack_chk_fail();
}

Assistant:

Map::const_iterator findKey(const QString &key) const
    { return itemList.constBegin() + findRecodedKey(recodeFromUser(key)); }